

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatorprofile.cpp
# Opt level: O1

string * __thiscall
libcellml::GeneratorProfile::implementationInitialiseVariablesMethodString_abi_cxx11_
          (string *__return_storage_ptr__,GeneratorProfile *this,bool forDifferentialModel,
          bool withExternalVariables)

{
  GeneratorProfileImpl *pGVar1;
  long lVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  
  pGVar1 = this->mPimpl;
  uVar3 = (ulong)(uint)((int)CONCAT71(in_register_00000009,withExternalVariables) << 6);
  uVar4 = uVar3 | 0x1230;
  lVar2 = uVar3 + 0x1228;
  if ((int)CONCAT71(in_register_00000011,forDifferentialModel) != 0) {
    uVar4 = uVar3 + 0x12b0;
    lVar2 = uVar3 + 0x12a8;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  lVar2 = *(long *)((long)&pGVar1->mProfile + lVar2);
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,lVar2,
             *(long *)((long)&pGVar1->mProfile + uVar4) + lVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string GeneratorProfile::implementationInitialiseVariablesMethodString(bool forDifferentialModel,
                                                                            bool withExternalVariables) const
{
    if (forDifferentialModel) {
        if (withExternalVariables) {
            return mPimpl->mImplementationInitialiseVariablesMethodFdmWevString;
        }

        return mPimpl->mImplementationInitialiseVariablesMethodFdmWoevString;
    }

    if (withExternalVariables) {
        return mPimpl->mImplementationInitialiseVariablesMethodFamWevString;
    }

    return mPimpl->mImplementationInitialiseVariablesMethodFamWoevString;
}